

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O0

void __thiscall
ncnn::Pooling1D::make_padding
          (Pooling1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  void *in_RCX;
  long in_RSI;
  long in_RDI;
  Option opt_b_3;
  int wpad_1;
  Option opt_b_2;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int wtail;
  int wtailpad;
  float pad_value;
  int w;
  Mat *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 local_14c;
  undefined1 local_140 [8];
  undefined8 local_138;
  float in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  Mat *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff00;
  Option *in_stack_ffffffffffffff08;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  undefined1 local_70 [8];
  undefined8 local_68;
  int local_30;
  int local_2c;
  undefined4 local_28;
  int local_24;
  void *local_20;
  long local_10;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_20 = in_RCX;
  local_10 = in_RSI;
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0);
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_14c = 0xc3000000;
    if (*(long *)(local_10 + 0x10) != 1) {
      local_14c = 0xff7fffff;
    }
    local_28 = local_14c;
  }
  else {
    local_28 = 0;
  }
  local_2c = 0;
  if (*(int *)(in_RDI + 0xe8) == 0) {
    local_30 = ((local_24 + *(int *)(in_RDI + 0xdc) + *(int *)(in_RDI + 0xe0)) -
               *(int *)(in_RDI + 0xd4)) % *(int *)(in_RDI + 0xd8);
    if (local_30 != 0) {
      local_2c = *(int *)(in_RDI + 0xd8) - local_30;
    }
    memcpy(local_70,local_20,0x40);
    local_68 = *(undefined8 *)((long)local_20 + 0x10);
    copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                     in_stack_ffffffffffffff00,in_stack_fffffffffffffed4,in_stack_ffffffffffffff08);
  }
  else if (*(int *)(in_RDI + 0xe8) == 1) {
    memcpy(local_b0,local_20,0x40);
    local_a8 = *(undefined8 *)((long)local_20 + 0x10);
    copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                     in_stack_ffffffffffffff00,in_stack_fffffffffffffed4,in_stack_ffffffffffffff08);
  }
  else if (*(int *)(in_RDI + 0xe8) == 2) {
    if (0 < (*(int *)(in_RDI + 0xd4) +
            ((local_24 + -1) / *(int *)(in_RDI + 0xd8)) * *(int *)(in_RDI + 0xd8)) - local_24) {
      memcpy(&stack0xffffffffffffff08,local_20,0x40);
      copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4
                       ,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8,in_stack_ffffffffffffff00,in_stack_fffffffffffffed4
                       ,in_stack_ffffffffffffff08);
    }
  }
  else if ((*(int *)(in_RDI + 0xe8) == 3) &&
          (0 < (*(int *)(in_RDI + 0xd4) +
               ((local_24 + -1) / *(int *)(in_RDI + 0xd8)) * *(int *)(in_RDI + 0xd8)) - local_24)) {
    memcpy(local_140,local_20,0x40);
    local_138 = *(undefined8 *)((long)local_20 + 0x10);
    copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                     in_stack_ffffffffffffff00,in_stack_fffffffffffffed4,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void Pooling1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;

        if (wtail != 0)
            wtailpad = stride_w - wtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}